

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O3

float wabt::interp::FloatMax<float>(float lhs,float rhs)

{
  if (NAN(lhs) || NAN(rhs)) {
    rhs = NAN;
  }
  else if ((((lhs != 0.0) || (NAN(lhs))) || (rhs != 0.0)) || (NAN(rhs))) {
    if (rhs <= lhs) {
      rhs = lhs;
    }
  }
  else if (-1 < (int)lhs) {
    rhs = lhs;
  }
  return rhs;
}

Assistant:

T WABT_VECTORCALL FloatMax(T lhs, T rhs) {
  if (WABT_UNLIKELY(std::isnan(lhs) || std::isnan(rhs))) {
    return std::numeric_limits<T>::quiet_NaN();
  } else if (WABT_UNLIKELY(lhs == 0 && rhs == 0)) {
    return std::signbit(lhs) ? rhs : lhs;
  } else {
    return std::max(lhs, rhs);
  }
}